

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::reactive_socket_service
          (reactive_socket_service<asio::ip::tcp> *this,io_context *io_context)

{
  reactor *prVar1;
  key local_18;
  
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.key_.type_info_ = (type_info *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.key_.id_ = (id *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.owner_ = &io_context->super_execution_context;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service.next_ = (service *)0x0;
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service._vptr_service = (_func_int **)&PTR__noncopyable_0017fd48;
  (this->super_reactive_socket_service_base).io_context_ = io_context;
  local_18.type_info_ = (type_info *)&typeid_wrapper<asio::detail::epoll_reactor>::typeinfo;
  local_18.id_ = (id *)0x0;
  prVar1 = (reactor *)
           service_registry::do_use_service
                     ((io_context->super_execution_context).service_registry_,&local_18,
                      service_registry::create<asio::detail::epoll_reactor,asio::io_context>,
                      io_context);
  (this->super_reactive_socket_service_base).reactor_ = prVar1;
  scheduler::init_task(prVar1->scheduler_);
  (this->super_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>).super_service.
  super_service._vptr_service = (_func_int **)&PTR__noncopyable_0017fc90;
  return;
}

Assistant:

reactive_socket_service(asio::io_context& io_context)
    : service_base<reactive_socket_service<Protocol> >(io_context),
      reactive_socket_service_base(io_context)
  {
  }